

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_csupport.cpp
# Opt level: O0

void kmpc_set_blocktime(int arg)

{
  int gtid_00;
  int tid_00;
  undefined4 in_EDI;
  kmp_info_t *thread;
  int tid;
  int gtid;
  
  gtid_00 = __kmp_get_global_thread_id_reg();
  tid_00 = __kmp_tid_from_gtid(gtid_00);
  __kmp_thread_from_gtid(gtid_00);
  __kmp_aux_set_blocktime(thread._4_4_,(kmp_info_t *)CONCAT44(in_EDI,gtid_00),tid_00);
  return;
}

Assistant:

void kmpc_set_blocktime(int arg) {
  int gtid, tid;
  kmp_info_t *thread;

  gtid = __kmp_entry_gtid();
  tid = __kmp_tid_from_gtid(gtid);
  thread = __kmp_thread_from_gtid(gtid);

  __kmp_aux_set_blocktime(arg, thread, tid);
}